

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

size_t __thiscall
libchars::commands::render(commands *this,size_t buf_idx,size_t limit,string *sequence)

{
  pointer pcVar1;
  token *ptVar2;
  string *psVar3;
  size_t *psVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long *local_58 [2];
  long local_48 [2];
  string *local_38;
  
  local_38 = sequence;
  parse(this);
  psVar4 = &(this->characters).
            super__Vector_base<libchars::command_char,_std::allocator<libchars::command_char>_>.
            _M_impl.super__Vector_impl_data._M_start[buf_idx].render_length;
  lVar7 = 0;
  uVar8 = 0;
  sVar5 = buf_idx;
  do {
    if (((this->super_edit_object).buflen <= sVar5) || (limit <= uVar8)) break;
    uVar6 = psVar4[-3] + uVar8;
    if (uVar6 <= limit) {
      lVar7 = lVar7 + *psVar4;
      uVar8 = uVar6;
    }
    psVar4 = psVar4 + 7;
    sVar5 = sVar5 + 1;
  } while (uVar6 <= limit);
  if (lVar7 == 0) {
    local_38->_M_string_length = 0;
    *(local_38->_M_dataplus)._M_p = '\0';
  }
  else {
    pcVar1 = (this->characters).
             super__Vector_base<libchars::command_char,_std::allocator<libchars::command_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar2 = pcVar1[buf_idx].T;
    if ((ptVar2 != (token *)0x0) && (ptVar2->offset < buf_idx)) {
      color_str(this,pcVar1[buf_idx].color);
      std::__cxx11::string::append((char *)local_38);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)&this->rendered_str);
    psVar3 = local_38;
    std::__cxx11::string::operator=((string *)local_38,(string *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    std::__cxx11::string::append((char *)psVar3);
  }
  return uVar8;
}

Assistant:

size_t commands::render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        parse();

        size_t idx = buf_idx, displayed = 0, r_offset = 0, r_length = 0;
        while (idx < length() && displayed < limit) {
            command_char &C = characters[idx++];
            if ((displayed + C.display_length) > limit)
                break;
            if (r_length == 0) {
                r_offset = C.render_offset;
                r_length = C.render_length;
            }
            else {
                r_length += C.render_length;
            }
            displayed += C.display_length;
        }

        if (r_length > 0) {
            // add token color if render has to start in the middle of a token
            command_char &C = characters[buf_idx];
            if (C.T != NULL && buf_idx > C.T->offset)
                sequence.append(color_str(C.color));
            sequence = rendered_str.substr(r_offset, r_length);
            sequence.append(color_str(COLOR_NORMAL)); // just in case the rest of the terminal gets messed up
        }
        else {
            sequence.clear();
        }

        return displayed;
    }